

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O0

void __thiscall
tlx::
SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
::resize(SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
         *this,size_type new_size)

{
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *pCVar1;
  unsigned_long *puVar2;
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *pCVar3;
  value_type *tmp;
  size_type new_size_local;
  SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
  *this_local;
  
  tmp = (value_type *)new_size;
  new_size_local = (size_type)this;
  if (this->array_ == (value_type *)0x0) {
    pCVar3 = create_array(new_size);
    this->array_ = pCVar3;
    this->size_ = (size_type)tmp;
  }
  else {
    pCVar3 = this->array_;
    pCVar1 = create_array(new_size);
    this->array_ = pCVar1;
    puVar2 = std::min<unsigned_long>(&this->size_,(unsigned_long *)&tmp);
    std::
    move<tlx::CountingPtr<foxxll::file,tlx::CountingPtrDefaultDeleter>*,tlx::CountingPtr<foxxll::file,tlx::CountingPtrDefaultDeleter>*>
              (pCVar3,pCVar3 + *puVar2,this->array_);
    destroy_array(pCVar3,this->size_);
    this->size_ = (size_type)tmp;
  }
  return;
}

Assistant:

void resize(size_type new_size) {
        if (array_) {
            value_type* tmp = array_;
            array_ = create_array(new_size);
            std::move(tmp, tmp + std::min(size_, new_size), array_);
            destroy_array(tmp, size_);
            size_ = new_size;
        }
        else {
            array_ = create_array(new_size);
            size_ = new_size;
        }
    }